

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

bool __thiscall wasm::LocalGraph::equivalent(LocalGraph *this,LocalGet *a,LocalGet *b)

{
  _Base_ptr p_Var1;
  bool bVar2;
  Sets *pSVar3;
  Sets *pSVar4;
  _Base_ptr p_Var5;
  Type TVar6;
  Type TVar7;
  _Base_ptr p_Var8;
  
  pSVar3 = getSets(this,a);
  pSVar4 = getSets(this,b);
  p_Var1 = (_Base_ptr)
           (pSVar3->
           super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
           ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var5 = p_Var1;
  if (p_Var1 == (_Base_ptr)0x0) {
    p_Var5 = (_Base_ptr)
             (pSVar3->
             super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
  }
  if (p_Var5 == (_Base_ptr)0x1) {
    p_Var5 = (_Base_ptr)
             (pSVar4->
             super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var8 = p_Var5;
    if (p_Var5 == (_Base_ptr)0x0) {
      p_Var8 = (_Base_ptr)
               (pSVar4->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
               ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
    }
    if (p_Var8 == (_Base_ptr)0x1) {
      p_Var8 = p_Var5;
      if (p_Var5 != (_Base_ptr)0x0) {
        p_Var8 = (pSVar4->
                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var8 = p_Var8 + 1;
      if (p_Var5 == (_Base_ptr)0x0) {
        p_Var8 = (_Base_ptr)
                 &(pSVar4->
                  super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
      }
      p_Var5 = p_Var1;
      if (p_Var1 != (_Base_ptr)0x0) {
        p_Var5 = (pSVar3->
                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var5 = p_Var5 + 1;
      if (p_Var1 == (_Base_ptr)0x0) {
        p_Var5 = (_Base_ptr)
                 &(pSVar3->
                  super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
      }
      if (*(long *)p_Var5 == *(long *)p_Var8) {
        if (*(long *)p_Var5 != 0) {
          return true;
        }
        bVar2 = Function::isParam((this->super_LocalGraphBase).func,a->index);
        if (bVar2) {
          return a->index == b->index;
        }
        TVar6 = Function::getLocalType((this->super_LocalGraphBase).func,a->index);
        TVar7 = Function::getLocalType((this->super_LocalGraphBase).func,b->index);
        return TVar6.id == TVar7.id;
      }
    }
  }
  return false;
}

Assistant:

bool LocalGraph::equivalent(LocalGet* a, LocalGet* b) {
  auto& aSets = getSets(a);
  auto& bSets = getSets(b);
  // The simple case of one set dominating two gets easily proves that they must
  // have the same value. (Note that we can infer dominance from the fact that
  // there is a single set: if the set did not dominate one of the gets then
  // there would definitely be another set for that get, the zero initialization
  // at the function entry, if nothing else.)
  if (aSets.size() != 1 || bSets.size() != 1) {
    // TODO: use a LinearExecutionWalker to find trivially equal gets in basic
    //       blocks. that plus the above should handle 80% of cases.
    // TODO: handle chains, merges and other situations
    return false;
  }
  auto* aSet = *aSets.begin();
  auto* bSet = *bSets.begin();
  if (aSet != bSet) {
    return false;
  }
  if (!aSet) {
    // They are both nullptr, indicating the implicit value for a parameter
    // or the zero for a local.
    if (func->isParam(a->index)) {
      // For parameters to be equivalent they must have the exact same
      // index.
      return a->index == b->index;
    } else {
      // As locals, they are both of value zero, but must have the right
      // type as well.
      return func->getLocalType(a->index) == func->getLocalType(b->index);
    }
  } else {
    // They are both the same actual set.
    return true;
  }
}